

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconvert.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  double dVar2;
  uchar uVar3;
  uchar uVar4;
  size_t sVar5;
  long lVar6;
  byte bVar7;
  uint i_1;
  char *pcVar8;
  uint i;
  uint uVar9;
  int iVar10;
  uint i_2;
  longdouble in_ST0;
  byte bStack_85;
  uchar flt_byte [4];
  uchar dbl_byte [8];
  char conversion [10];
  byte bStack_69;
  uchar flt80_byte [16];
  
  if (argc - 4U < 0xfffffffe) {
    pcVar8 = "Usage: fpconvert <floating-point> [<conversion>]";
  }
  else {
    lVar6 = 0;
    flt.value = strtof(argv[1],(char **)0x0);
    dbl.value = strtod(argv[1],(char **)0x0);
    strtold(argv[1],(char **)0x0);
    flt_byte[0] = flt._0_1_;
    flt_byte[1] = flt._1_1_;
    flt_byte[2] = flt._2_1_;
    flt_byte[3] = flt._3_1_;
    dbl_byte[0] = dbl._0_1_;
    dbl_byte[1] = dbl._1_1_;
    dbl_byte[2] = dbl._2_1_;
    dbl_byte[3] = dbl._3_1_;
    dbl_byte[4] = dbl._4_1_;
    dbl_byte[5] = dbl._5_1_;
    dbl_byte[6] = dbl._6_1_;
    dbl_byte[7] = dbl._7_1_;
    flt80_byte[10] = flt80._10_1_;
    flt80_byte[0xb] = flt80._11_1_;
    flt80_byte[0xc] = flt80._12_1_;
    flt80_byte[0xd] = flt80._13_1_;
    flt80_byte[0xe] = flt80._14_1_;
    flt80_byte[0xf] = flt80._15_1_;
    flt80_byte._0_10_ = in_ST0;
    flt80.value = in_ST0;
    puts("------------------- float --------------------");
    printf("Bits: %zu\n",0x20);
    uVar3 = flt_byte[2];
    uVar4 = flt_byte[3];
    printf("Hex:  %02x%02x.%02x%02x.\n",(ulong)flt_byte[3],(ulong)flt_byte[2],(ulong)flt_byte[1],
           (ulong)flt_byte[0]);
    do {
      if (flt_byte[lVar6] != flt.byte[lVar6]) {
        __assert_fail("flt_byte[ i ] == flt.byte[ i ]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/auxiliary/fpconvert/fpconvert.c"
                      ,0x74,"int main(int, char **)");
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    printf("Bin:  seee.eeee.efff.ffff.ffff.ffff.ffff.ffff.\n      ");
    lVar6 = 4;
    do {
      printf("%s.%s.",nibbles[flt_byte[lVar6 + -1] >> 4],nibbles[flt_byte[lVar6 + -1] & 0xf]);
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    putchar(10);
    bVar7 = uVar4 * '\x02' | uVar3 >> 7;
    lVar6 = 0;
    printf("Exp:  %#x      Unbiased: %d\n",(ulong)bVar7,(ulong)(bVar7 - 0x7f));
    puts("------------------ double --------------------");
    printf("Bits: %zu\n",0x40);
    uVar3 = dbl_byte[6];
    uVar9 = (uint)dbl_byte[7];
    printf("Hex:  %02x%02x.%02x%02x.%02x%02x.%02x%02x.\n",(ulong)dbl_byte[7],(ulong)dbl_byte[6],
           (ulong)dbl_byte >> 0x28 & 0xff,(ulong)dbl_byte >> 0x20 & 0xff,
           (ulong)dbl_byte >> 0x18 & 0xff,(ulong)dbl_byte >> 0x10 & 0xff,(ulong)dbl_byte >> 8 & 0xff
           ,(ulong)dbl_byte & 0xff);
    do {
      if (dbl_byte[lVar6] != dbl.byte[lVar6]) {
        __assert_fail("dbl_byte[ i ] == dbl.byte[ i ]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/auxiliary/fpconvert/fpconvert.c"
                      ,0x90,"int main(int, char **)");
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    printf("Bin:  seee.eeee.eeee.ffff.ffff.ffff.ffff.ffff.\n      ");
    lVar6 = 8;
    do {
      printf("%s.%s.",nibbles[flt_byte[lVar6 + 3] >> 4],nibbles[flt_byte[lVar6 + 3] & 0xf]);
      if (((uint)lVar6 & 3) == 1 && lVar6 != 1) {
        printf("\n      ffff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      ");
      }
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    putchar(10);
    iVar10 = (uVar9 & 0x7f) * 0x10;
    lVar6 = 0;
    printf("Exp:  %#x      Unbiased: %d\n",(ulong)(iVar10 + (uint)(uVar3 >> 4)),
           (ulong)((iVar10 + (uint)(uVar3 >> 4)) - 0x3ff));
    puts("------------------ float80 -------------------");
    printf("Bits: %zu (48 unused, 80 encoded)\n",0x80);
    uVar4 = flt80_byte[8];
    uVar3 = flt80_byte[7];
    uVar9 = (uint)flt80_byte[9];
    printf("Hex:  %02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.\n",(ulong)flt80_byte[9],
           (ulong)flt80_byte[8],(ulong)flt80_byte[7],(ulong)flt80_byte[6],(ulong)flt80_byte[5],
           (ulong)flt80_byte[4],(ulong)flt80_byte[3],(ulong)flt80_byte[2],(ulong)flt80_byte[1],
           (ulong)flt80_byte[0]);
    do {
      if (flt80_byte[lVar6] != flt80.byte[lVar6]) {
        __assert_fail("flt80_byte[ i ] == flt80.byte[ i ]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/auxiliary/fpconvert/fpconvert.c"
                      ,0xb1,"int main(int, char **)");
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
    printf("Bin:  seee.eeee.eeee.eeee.\n      ");
    lVar6 = 10;
    do {
      printf("%s.%s.",nibbles[flt80_byte[lVar6 + -1] >> 4],nibbles[flt80_byte[lVar6 + -1] & 0xf]);
      pcVar8 = "\n      ifff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      ";
      if ((int)lVar6 == 9) {
LAB_00101582:
        printf(pcVar8);
      }
      else if ((int)lVar6 == 5) {
        pcVar8 = "\n      ffff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      ";
        goto LAB_00101582;
      }
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    putchar(10);
    iVar10 = (uVar9 & 0x7f) * 0x100;
    printf("Exp:  %#x      Unbiased: %d\n",(ulong)(iVar10 + (uint)uVar4),
           (ulong)((iVar10 + (uint)uVar4) - 0x3fff));
    printf("Dec:  %d\n",(ulong)(uVar3 >> 7));
    puts("----------------------------------------------");
    if (argc != 3) {
      return 0;
    }
    conversion[8] = '\0';
    conversion[9] = '\0';
    conversion[0] = '%';
    conversion[1] = '\0';
    conversion[2] = '\0';
    conversion[3] = '\0';
    conversion[4] = '\0';
    conversion[5] = '\0';
    conversion[6] = '\0';
    conversion[7] = '\0';
    if (*argv[2] == '%') {
      argv[2] = argv[2] + 1;
    }
    pcVar8 = argv[2];
    sVar5 = strlen(pcVar8);
    if (sVar5 < 9) {
      strcat(conversion,pcVar8);
      sVar5 = strlen(conversion);
      (conversion + sVar5)[0] = '\n';
      (conversion + sVar5)[1] = '\0';
      dVar2 = strtod(argv[1],(char **)0x0);
      printf(conversion,SUB84(dVar2,0));
      sVar5 = strlen(conversion);
      cVar1 = conversion[sVar5];
      *(undefined2 *)(dbl_byte + sVar5 + 7) = *(undefined2 *)(dbl_byte + sVar5 + 6);
      conversion[sVar5 + 1] = cVar1;
      dbl_byte[sVar5 + 6] = 'L';
      dVar2 = strtold(argv[1],(char **)0x0);
      printf(conversion,SUB84(dVar2,0));
      return 0;
    }
    pcVar8 = "Conversion too long (8 characters max)";
  }
  puts(pcVar8);
  return 1;
}

Assistant:

int main( int argc, char * argv[] )
{
    unsigned char    flt_byte[ sizeof( float ) ];
    unsigned char    dbl_byte[ sizeof( double ) ];
#ifdef FLOAT80
    unsigned char  flt80_byte[ sizeof( long double ) ];
#endif
#ifdef FLOAT128
    unsigned char flt128_byte[ sizeof( float128_t ) ];
#endif

    int exp;

    if ( argc < 2 || argc > 3 )
    {
        puts( "Usage: fpconvert <floating-point> [<conversion>]" );
        return 1;
    }

    flt.value    =    strtof( argv[1], NULL );
    dbl.value    =    strtod( argv[1], NULL );
#ifdef FLOAT80
    flt80.value  =   strtold( argv[1], NULL );
#endif
#ifdef FLOAT128
    flt128.value = strtof128( argv[1], NULL );
#endif

    memcpy(    flt_byte,    &flt.value, sizeof( float ) );
    memcpy(    dbl_byte,    &dbl.value, sizeof( double ) );
#ifdef FLOAT80
    memcpy(  flt80_byte,  &flt80.value, sizeof( long double ) );
#endif
#ifdef FLOAT128
    memcpy( flt128_byte, &flt128.value, sizeof( float128_t ) );
#endif

    puts( "------------------- float --------------------" );

    printf( "Bits: %zu\n", sizeof( float ) * CHAR_BIT );

    printf( "Hex:  %02x%02x.%02x%02x.\n", flt_byte[ 3 ], flt_byte[ 2 ], flt_byte[ 1 ], flt_byte[ 0 ] );

    /* Asserting identity of memcpy bytes and union bytes */
    for ( unsigned i = 0; i < sizeof( float ); ++i )
    {
        assert( flt_byte[ i ] == flt.byte[ i ] );
    }

    /* Printing binary dump of whole register */
    printf( "Bin:  seee.eeee.efff.ffff.ffff.ffff.ffff.ffff.\n      " );

    for ( unsigned i = sizeof( float ); i > 0; --i )
    {
        unsigned high_nibble = ( flt_byte[ i - 1 ] & 0xf0 ) >> 4;
        printf( "%s.%s.", nibbles[ high_nibble ], nibbles[ flt_byte[ i - 1 ] & 0x0f ] );
    }

    puts( "" );

    /* Extracting exponent from memcpy bytes */
    exp = ( ( (unsigned)flt_byte[3] & 0x7f ) << 1 ) | ( (unsigned)flt_byte[2] >> 7 );

    printf( "Exp:  %#x      Unbiased: %d\n", exp, exp - _PDCLIB_FLT_BIAS );

    puts( "------------------ double --------------------" );

    printf( "Bits: %zu\n", sizeof( double ) * CHAR_BIT );

    printf( "Hex:  %02x%02x.%02x%02x.%02x%02x.%02x%02x.\n", dbl_byte[ 7 ], dbl_byte[ 6 ], dbl_byte[ 5 ], dbl_byte[ 4 ], dbl_byte[ 3 ], dbl_byte[ 2 ], dbl_byte[ 1 ], dbl_byte[ 0 ] );

    /* Asserting identity of memcpy bytes and union bytes */
    for ( unsigned i = 0; i < sizeof( double ); ++i )
    {
        assert( dbl_byte[ i ] == dbl.byte[ i ] );
    }

    /* Printing binary dump of whole register */
    printf( "Bin:  seee.eeee.eeee.ffff.ffff.ffff.ffff.ffff.\n      " );

    for ( unsigned i = sizeof( double ); i > 0; --i )
    {
        unsigned high_nibble = ( dbl_byte[ i - 1 ] & 0xf0 ) >> 4;
        printf( "%s.%s.", nibbles[ high_nibble ], nibbles[ dbl_byte[ i - 1 ] & 0x0f ] );
        if ( ( i > 1 ) && ( i % 4 == 1 ) ) printf( "\n      ffff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      " );
    }

    puts( "" );

    /* Extracting exponent from memcpy bytes */
    exp = ( ( (unsigned)dbl_byte[7] & 0x7f ) << 4 ) | ( ( (unsigned)dbl_byte[6] & 0xf0 ) >> 4 );

    printf( "Exp:  %#x      Unbiased: %d\n", exp, exp - _PDCLIB_DBL_BIAS );

#ifdef FLOAT80
    puts( "------------------ float80 -------------------" );

    printf( "Bits: %zu (48 unused, 80 encoded)\n", sizeof( long double ) * CHAR_BIT );

    printf( "Hex:  %02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.\n",
            flt80_byte[ 9 ], flt80_byte[ 8 ],
            flt80_byte[ 7 ], flt80_byte[ 6 ], flt80_byte[ 5 ], flt80_byte[ 4 ],
            flt80_byte[ 3 ], flt80_byte[ 2 ], flt80_byte[ 1 ], flt80_byte[ 0 ] );

    /* Asserting identity of memcpy bytes and union bytes */
    for ( unsigned i = 0; i < sizeof( long double ); ++i )
    {
        assert( flt80_byte[ i ] == flt80.byte[ i ] );
    }

    /* Printing binary dump of significant parts of register */
    printf( "Bin:  seee.eeee.eeee.eeee.\n      " );

    for ( unsigned i = sizeof( long double ) - 6; i > 0; --i )
    {
        unsigned high_nibble = ( flt80_byte[ i - 1 ] & 0xf0 ) >> 4;
        printf( "%s.%s.", nibbles[ high_nibble ], nibbles[ flt80_byte[ i - 1 ] & 0x0f ] );
        if ( i == 9 ) printf( "\n      ifff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      " );
        if ( i == 5 ) printf( "\n      ffff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      " );
    }

    puts( "" );

    /* Extracting exponent from memcpy bytes */
    exp = ( ( (unsigned)flt80_byte[9] & 0x7f ) << 8 ) | (unsigned)flt80_byte[8];

    printf( "Exp:  %#x      Unbiased: %d\n", exp, exp - _PDCLIB_FLT80_BIAS );

    /* Printing decimal */
    printf( "Dec:  %d\n", ( (unsigned)flt80_byte[7] & 0x80 ) == 0x80 );

#endif

#ifdef FLOAT128
    puts( "----------------- float128 -------------------" );

    printf( "Bits: %zu\n", sizeof( float128_t ) * CHAR_BIT );

    printf( "Hex:  %02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.%02x%02x.\n",
            flt128_byte[ 15 ], flt128_byte[ 14 ], flt128_byte[ 13 ], flt128_byte[ 12 ],
            flt128_byte[ 11 ], flt128_byte[ 10 ], flt128_byte[  9 ], flt128_byte[  8 ],
            flt128_byte[  7 ], flt128_byte[  6 ], flt128_byte[  5 ], flt128_byte[  4 ],
            flt128_byte[  3 ], flt128_byte[  2 ], flt128_byte[  1 ], flt128_byte[  0 ] );

    /* Asserting identity of memcpy bytes and union bytes */
    for ( unsigned i = 0; i < sizeof( float128_t ); ++i )
    {
        assert( flt128_byte[ i ] == flt128.byte[ i ] );
    }

    /* Printing binary dump of whole register */
    printf( "Bin:  seee.eeee.eeee.eeee.ffff.ffff.ffff.ffff.\n      " );

    for ( unsigned i = sizeof( float128_t ); i > 0; --i )
    {
        unsigned high_nibble = ( flt128_byte[ i - 1 ] & 0xf0 ) >> 4;
        printf( "%s.%s.", nibbles[ high_nibble ], nibbles[ flt128_byte[ i - 1 ] & 0x0f ] );
        if ( ( i > 1 ) && ( i % 4 == 1 ) ) printf( "\n      ffff.ffff.ffff.ffff.ffff.ffff.ffff.ffff.\n      " );
    }

    puts( "" );

    /* Extracting exponent from memcpy bytes */
    exp = ( ( (unsigned)flt128_byte[ 15 ] & 0x7f ) << 8 ) | (unsigned)flt128_byte[ 14 ];

    printf( "Exp:  %#x      Unbiased: %d\n", exp, exp - _PDCLIB_FLT128_BIAS );
#endif

    puts( "----------------------------------------------" );

    if ( argc == 3 )
    {
        char conversion[ 10 ] = "%";
        size_t len;

        if ( argv[ 2 ][ 0 ] == '%' )
        {
            ++argv[ 2 ];
        }

        if ( strlen( argv[ 2 ] ) > 8 )
        {
            puts( "Conversion too long (8 characters max)" );
            return 1;
        }

        /* Print the fp value with the conversion given */
        strcat( conversion, argv[ 2 ] );
        strcat( conversion, "\n" );
        printf( conversion, strtod( argv[ 1 ], NULL ) );

        /* Do the same with long double precision */
        len = strlen( conversion );
        memmove( conversion + len - 1, conversion + len - 2, 3 );
        conversion[ len - 2 ] = 'L';
        printf( conversion, strtold( argv[ 1 ], NULL ) );
    }
}